

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ScopeBegin(Parser *this)

{
  bool bVar1;
  pointer local_10;
  
  bVar1 = VariableStackFrame::ScopeBegin(&this->m_variableStackFrame);
  if (!bVar1) {
    local_10 = (this->m_variableStackFrame).m_errorMessage._M_dataplus._M_p;
    Error<char_const*>(this,"%s",&local_10);
  }
  EmitOpcode(this,ScopeBegin);
  return;
}

Assistant:

inline void Parser::ScopeBegin()
	{
		if (!m_variableStackFrame.ScopeBegin())
			Error("%s", m_variableStackFrame.GetErrorMessage());
		EmitOpcode(Opcode::ScopeBegin);
	}